

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O1

ze_result_t
tracing_layer::zeCommandListAppendImageCopyFromMemoryExt
          (ze_command_list_handle_t hCommandList,ze_image_handle_t hDstImage,void *srcptr,
          ze_image_region_t *pDstRegion,uint32_t srcRowPitch,uint32_t srcSlicePitch,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  _func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_command_list_handle_t_ptr__ze_image_handle_t_ptr_void_ptr__ze_image_region_t_ptr_uint_uint__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  char *pcVar3;
  ulong *puVar4;
  _ze_image_region_t *in_RCX;
  void *in_RDX;
  long lVar5;
  _ze_image_handle_t *in_RSI;
  _ze_command_list_handle_t *in_RDI;
  uint in_R8D;
  uint in_R9D;
  ulong uVar6;
  _ze_event_handle_t *in_stack_00000008;
  uint in_stack_00000010;
  _ze_event_handle_t **in_stack_00000018;
  APITracerCallbackDataImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_command_list_append_image_copy_from_memory_ext_params_t tracerParams;
  uint local_130;
  uint local_12c;
  _ze_image_region_t *local_128;
  void *local_120;
  _ze_image_handle_t *local_118;
  _ze_command_list_handle_t *local_110;
  _func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *local_108;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  vStack_100;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_e8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_c8;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_b0;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_98;
  APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
  local_88;
  _ze_command_list_append_image_copy_from_memory_ext_params_t local_78;
  
  if (DAT_0017f418 ==
      (_func__ze_result_t__ze_command_list_handle_t_ptr__ze_image_handle_t_ptr_void_ptr__ze_image_region_t_ptr_uint_uint__ze_event_handle_t_ptr_uint__ze_event_handle_t_ptr_ptr
       *)0x0) {
    _Var2 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    local_130 = in_R9D;
    local_12c = in_R8D;
    local_128 = in_RCX;
    local_120 = in_RDX;
    local_118 = in_RSI;
    local_110 = in_RDI;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar3 = (char *)__tls_get_addr(&PTR_0017efa0);
    if (*pcVar3 == '\0') {
      tracing_layer::tracingInProgress::__tls_init();
      *pcVar3 = '\x01';
      local_78.phCommandList = &local_110;
      local_78.phDstImage = &local_118;
      local_78.psrcptr = &local_120;
      local_78.ppDstRegion = &local_128;
      local_78.psrcRowPitch = &local_12c;
      local_78.psrcSlicePitch = &local_130;
      local_78.phSignalEvent = &stack0x00000008;
      local_78.pnumWaitEvents = &stack0x00000010;
      local_78.pphWaitEvents = &stack0x00000018;
      local_e8.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      vStack_100.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      vStack_100.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      local_108 = (_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   *)0x0;
      vStack_100.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>
            *)0x0;
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if ((puVar4 != (ulong *)0x0) && (*puVar4 != 0)) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          local_88.current_api_callback =
               *(_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0x308 + lVar5);
          p_Var1 = *(_func_void__ze_command_list_append_image_copy_from_memory_ext_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + 0x960 + lVar5);
          local_88.pUserData = *(void **)(puVar4[1] + 0xcb0 + lVar5);
          if (vStack_100.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vStack_100.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>
                        *)&vStack_100,
                       (iterator)
                       vStack_100.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_88);
          }
          else {
            (vStack_100.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
                 local_88.current_api_callback;
            (vStack_100.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_88.pUserData;
            vStack_100.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 vStack_100.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_98.pUserData = *(void **)(puVar4[1] + 0xcb0 + lVar5);
          local_98.current_api_callback = p_Var1;
          if (local_e8.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_e8.
              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>
            ::
            _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>const&>
                      ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>
                        *)&local_e8,
                       (iterator)
                       local_e8.
                       super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_98);
          }
          else {
            (local_e8.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var1;
            (local_e8.
             super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->pUserData = local_98.pUserData;
            local_e8.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_e8.
                 super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0xcb8;
        } while (uVar6 < *puVar4);
      }
      p_Var1 = local_108;
      zeApiPtr = DAT_0017f418;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_b0,&vStack_100);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_c8,&local_e8);
      _Var2 = APITracerWrapperImp<_ze_result_t(*)(_ze_command_list_handle_t*,_ze_image_handle_t*,void_const*,_ze_image_region_t_const*,unsigned_int,unsigned_int,_ze_event_handle_t*,unsigned_int,_ze_event_handle_t**),_ze_command_list_append_image_copy_from_memory_ext_params_t*,void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t*,_ze_result_t,void*,void**)>>>,_ze_command_list_handle_t*&,_ze_image_handle_t*&,void_const*&,_ze_image_region_t_const*&,unsigned_int&,unsigned_int&,_ze_event_handle_t*&,unsigned_int&,_ze_event_handle_t**&>
                        (zeApiPtr,&local_78,p_Var1,&local_b0,&local_c8,local_78.phCommandList,
                         local_78.phDstImage,local_78.psrcptr,local_78.ppDstRegion,
                         local_78.psrcRowPitch,local_78.psrcSlicePitch,local_78.phSignalEvent,
                         local_78.pnumWaitEvents,local_78.pphWaitEvents);
      if (local_c8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_b0.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vStack_100.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_100.
                        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_100.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_100.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_command_list_append_image_copy_from_memory_ext_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      _Var2 = (*DAT_0017f418)(local_110,local_118,local_120,local_128,local_12c,local_130,
                              in_stack_00000008,in_stack_00000010,in_stack_00000018);
    }
  }
  return _Var2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendImageCopyFromMemoryExt(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of command list
        ze_image_handle_t hDstImage,                    ///< [in] handle of destination image to copy to
        const void* srcptr,                             ///< [in] pointer to source memory to copy from
        const ze_image_region_t* pDstRegion,            ///< [in][optional] destination region descriptor
        uint32_t srcRowPitch,                           ///< [in] size in bytes of the 1D slice of the 2D region of a 2D or 3D
                                                        ///< image or each image of a 1D or 2D image array being read
        uint32_t srcSlicePitch,                         ///< [in] size in bytes of the 2D slice of the 3D region of a 3D image or
                                                        ///< each image of a 1D or 2D image array being read
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before launching; must be 0
                                                        ///< if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before launching
        )
    {
        auto pfnAppendImageCopyFromMemoryExt = context.zeDdiTable.CommandList.pfnAppendImageCopyFromMemoryExt;

        if( nullptr == pfnAppendImageCopyFromMemoryExt)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.CommandList.pfnAppendImageCopyFromMemoryExt, hCommandList, hDstImage, srcptr, pDstRegion, srcRowPitch, srcSlicePitch, hSignalEvent, numWaitEvents, phWaitEvents);

        // capture parameters
        ze_command_list_append_image_copy_from_memory_ext_params_t tracerParams = {
            &hCommandList,
            &hDstImage,
            &srcptr,
            &pDstRegion,
            &srcRowPitch,
            &srcSlicePitch,
            &hSignalEvent,
            &numWaitEvents,
            &phWaitEvents
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnCommandListAppendImageCopyFromMemoryExtCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnCommandListAppendImageCopyFromMemoryExtCb_t, CommandList, pfnAppendImageCopyFromMemoryExtCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.CommandList.pfnAppendImageCopyFromMemoryExt,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phCommandList,
                                                  *tracerParams.phDstImage,
                                                  *tracerParams.psrcptr,
                                                  *tracerParams.ppDstRegion,
                                                  *tracerParams.psrcRowPitch,
                                                  *tracerParams.psrcSlicePitch,
                                                  *tracerParams.phSignalEvent,
                                                  *tracerParams.pnumWaitEvents,
                                                  *tracerParams.pphWaitEvents);
    }